

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void textfile_bang(t_qlist *x)

{
  _outlet *x_00;
  uint uVar1;
  t_atom *ptVar2;
  t_atom *ptVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  uVar6 = x->x_onset;
  uVar7 = (ulong)(int)uVar6;
  ptVar2 = binbuf_getvec((x->x_textbuf).b_binbuf);
  ptVar2 = ptVar2 + uVar7;
  if ((int)uVar6 < (int)uVar1) {
    do {
      uVar6 = (uint)uVar7;
      if ((ptVar2->a_type & ~A_FLOAT) != A_SEMI) goto LAB_0018dfd9;
      uVar7 = (ulong)(uVar6 + 1);
      ptVar2 = ptVar2 + 1;
    } while (uVar1 != uVar6 + 1);
  }
  else {
LAB_0018dfd9:
    ptVar3 = ptVar2;
    uVar4 = uVar6;
    if ((int)uVar6 < (int)uVar1) {
      do {
        uVar5 = uVar4;
        if ((ptVar3->a_type & ~A_FLOAT) == A_SEMI) break;
        uVar4 = uVar4 + 1;
        ptVar3 = ptVar3 + 1;
        uVar5 = uVar1;
      } while (uVar1 != uVar4);
      if (uVar5 - uVar6 != 0 && (int)uVar6 <= (int)uVar5) {
        x->x_onset = uVar5;
        x_00 = (x->x_textbuf).b_ob.te_outlet;
        if (ptVar2->a_type != A_SYMBOL) {
          outlet_list(x_00,(t_symbol *)0x0,uVar5 - uVar6,ptVar2);
          return;
        }
        outlet_anything(x_00,(ptVar2->a_w).w_symbol,uVar5 + ~uVar6,ptVar2 + 1);
        return;
      }
    }
  }
  x->x_onset = 0x7fffffff;
  outlet_bang(x->x_bangout);
  return;
}

Assistant:

static void textfile_bang(t_qlist *x)
{
    int argc = binbuf_getnatom(x->x_binbuf),
        onset = x->x_onset, onset2;
    t_atom *argv = binbuf_getvec(x->x_binbuf);
    t_atom *ap = argv + onset, *ap2;
    while (onset < argc &&
        (ap->a_type == A_SEMI || ap->a_type == A_COMMA))
            onset++, ap++;
    onset2 = onset;
    ap2 = ap;
    while (onset2 < argc &&
        (ap2->a_type != A_SEMI && ap2->a_type != A_COMMA))
            onset2++, ap2++;
    if (onset2 > onset)
    {
        x->x_onset = onset2;
        if (ap->a_type == A_SYMBOL)
            outlet_anything(x->x_ob.ob_outlet, ap->a_w.w_symbol,
                onset2-onset-1, ap+1);
        else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
    }
    else
    {
        x->x_onset = 0x7fffffff;
        outlet_bang(x->x_bangout);
    }
}